

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O1

void __thiscall
jsonnet::internal::ObjectField::ObjectField
          (ObjectField *this,Kind kind,Fodder *fodder1,Fodder *fodder2,Fodder *fodder_l,
          Fodder *fodder_r,Hide hide,bool super_sugar,bool method_sugar,AST *expr1,Identifier *id,
          LocationRange *id_lr,ArgParams *params,bool trailing_comma,Fodder *op_fodder,AST *expr2,
          AST *expr3,Fodder *comma_fodder)

{
  pointer pcVar1;
  unsigned_long uVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  
  this->kind = kind;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodder1,fodder1);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodder2,fodder2);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodderL,fodder_l);
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->fodderR,fodder_r);
  this->hide = hide;
  this->superSugar = super_sugar;
  this->methodSugar = method_sugar;
  this->expr1 = expr1;
  this->id = id;
  (this->idLocation).file._M_dataplus._M_p = (pointer)&(this->idLocation).file.field_2;
  pcVar1 = (id_lr->file)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->idLocation,pcVar1,pcVar1 + (id_lr->file)._M_string_length);
  uVar2 = (id_lr->begin).line;
  uVar3 = (id_lr->begin).column;
  uVar4 = (id_lr->end).column;
  (this->idLocation).end.line = (id_lr->end).line;
  (this->idLocation).end.column = uVar4;
  (this->idLocation).begin.line = uVar2;
  (this->idLocation).begin.column = uVar3;
  std::vector<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>::vector
            (&this->params,params);
  this->trailingComma = trailing_comma;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->opFodder,op_fodder);
  this->expr2 = expr2;
  this->expr3 = expr3;
  std::vector<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>::
  vector(&this->commaFodder,comma_fodder);
  if (kind == LOCAL) {
    if ((hide != VISIBLE) || (this->superSugar == true)) {
      __assert_fail("kind != LOCAL || (hide == VISIBLE && !superSugar)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                    0x2ae,
                    "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                   );
    }
  }
  else if (kind == FIELD_ID) {
    if ((expr1 != (AST *)0x0) || (id == (Identifier *)0x0)) {
      __assert_fail("kind != FIELD_ID || (id != nullptr && expr1 == nullptr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                    0x2af,
                    "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                   );
    }
  }
  else if ((kind == ASSERT) &&
          (((hide != VISIBLE || (this->superSugar != false)) || (this->methodSugar == true)))) {
    __assert_fail("kind != ASSERT || (hide == VISIBLE && !superSugar && !methodSugar)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2ad,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  if (((id != (Identifier *)0x0) && (kind != FIELD_ID)) && (kind != LOCAL)) {
    __assert_fail("kind == FIELD_ID || kind == LOCAL || id == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2b0,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  if ((this->methodSugar == false) &&
     (((params->
       super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
       )._M_impl.super__Vector_impl_data._M_finish !=
       (params->
       super__Vector_base<jsonnet::internal::ArgParam,_std::allocator<jsonnet::internal::ArgParam>_>
       )._M_impl.super__Vector_impl_data._M_start || (this->trailingComma == true)))) {
    __assert_fail("methodSugar || (params.size() == 0 && !trailingComma)",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2b1,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  if (expr3 != (AST *)0x0 && kind != ASSERT) {
    __assert_fail("kind == ASSERT || expr3 == nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/core/ast.h",
                  0x2b2,
                  "jsonnet::internal::ObjectField::ObjectField(enum Kind, const Fodder &, const Fodder &, const Fodder &, const Fodder &, enum Hide, bool, bool, AST *, const Identifier *, const LocationRange &, const ArgParams &, bool, const Fodder &, AST *, AST *, const Fodder &)"
                 );
  }
  return;
}

Assistant:

ObjectField(enum Kind kind, const Fodder &fodder1, const Fodder &fodder2,
                const Fodder &fodder_l, const Fodder &fodder_r, enum Hide hide, bool super_sugar,
                bool method_sugar, AST *expr1, const Identifier *id, const LocationRange &id_lr,
                const ArgParams &params, bool trailing_comma, const Fodder &op_fodder, AST *expr2,
                AST *expr3, const Fodder &comma_fodder)
        : kind(kind),
          fodder1(fodder1),
          fodder2(fodder2),
          fodderL(fodder_l),
          fodderR(fodder_r),
          hide(hide),
          superSugar(super_sugar),
          methodSugar(method_sugar),
          expr1(expr1),
          id(id),
          idLocation(id_lr),
          params(params),
          trailingComma(trailing_comma),
          opFodder(op_fodder),
          expr2(expr2),
          expr3(expr3),
          commaFodder(comma_fodder)
    {
        // Enforce what is written in comments above.
        assert(kind != ASSERT || (hide == VISIBLE && !superSugar && !methodSugar));
        assert(kind != LOCAL || (hide == VISIBLE && !superSugar));
        assert(kind != FIELD_ID || (id != nullptr && expr1 == nullptr));
        assert(kind == FIELD_ID || kind == LOCAL || id == nullptr);
        assert(methodSugar || (params.size() == 0 && !trailingComma));
        assert(kind == ASSERT || expr3 == nullptr);
    }